

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O3

void __thiscall
spoa::SisdAlignmentEngine::Initialize
          (SisdAlignmentEngine *this,char *sequence,uint32_t sequence_len,Graph *graph)

{
  char cVar1;
  AlignmentSubtype AVar2;
  AlignmentType AVar3;
  pointer puVar4;
  pointer puVar5;
  pointer piVar6;
  pointer ppNVar7;
  long lVar8;
  int32_t *piVar9;
  pointer ppEVar10;
  pointer ppEVar11;
  int32_t *piVar12;
  int32_t *piVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  Implementation *pIVar21;
  ulong uVar22;
  undefined8 *puVar23;
  const_iterator __begin4;
  ulong uVar24;
  const_iterator __begin3;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar34 [32];
  undefined1 auVar38 [32];
  undefined1 auVar45 [32];
  undefined1 auVar41 [32];
  undefined1 auVar47 [64];
  
  auVar39 = in_ZMM3._0_32_;
  puVar4 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar20 = sequence_len + 1;
  puVar5 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (graph->num_codes_ != 0) {
    piVar6 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = 1;
    uVar24 = 0;
    lVar19 = *(long *)&(((this->pimpl_)._M_t.
                         super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                         .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                        _M_head_impl)->sequence_profile).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    do {
      iVar18 = piVar6[uVar24 & 0xff];
      *(undefined4 *)(lVar19 + (ulong)(uVar20 * (int)uVar24) * 4) = 0;
      if (sequence_len != 0) {
        uVar22 = 0;
        do {
          uVar27 = uVar22 + 1;
          *(int *)(lVar19 + (ulong)(uint)((int)uVar22 + iVar17) * 4) =
               (int)*(char *)((long)&(this->super_AlignmentEngine)._vptr_AlignmentEngine +
                             ((ulong)(sequence[uVar22] == (char)iVar18) ^ 0x11));
          uVar22 = uVar27;
        } while (sequence_len != uVar27);
      }
      uVar24 = uVar24 + 1;
      iVar17 = iVar17 + uVar20;
    } while (uVar24 < graph->num_codes_);
  }
  ppNVar7 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar19 = (long)(graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar7;
  if (lVar19 != 0) {
    uVar24 = 0;
    lVar8 = *(long *)&(((this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                       _M_head_impl)->node_id_to_rank).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    do {
      *(int *)(lVar8 + (ulong)ppNVar7[uVar24]->id * 4) = (int)uVar24;
      uVar24 = uVar24 + 1;
    } while ((uVar24 & 0xffffffff) < (ulong)(lVar19 >> 3));
  }
  AVar2 = (this->super_AlignmentEngine).subtype_;
  uVar25 = (int)((ulong)((long)puVar4 - (long)puVar5) >> 3) + 1;
  uVar24 = (ulong)uVar25;
  if (AVar2 == kConvex) {
    pIVar21 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
              _M_head_impl;
    piVar9 = pIVar21->O;
    *piVar9 = 0;
    piVar12 = pIVar21->Q;
    *piVar12 = 0;
    if (1 < uVar20) {
      iVar17 = (int)(this->super_AlignmentEngine).q_;
      cVar1 = (this->super_AlignmentEngine).c_;
      uVar22 = 1;
      do {
        piVar9[uVar22] = -0x7ffffc00;
        piVar12[uVar22] = iVar17;
        uVar22 = uVar22 + 1;
        iVar17 = iVar17 + cVar1;
      } while (uVar20 != uVar22);
    }
    if (1 < uVar25) {
      auVar41._8_4_ = 0x80000400;
      auVar41._0_8_ = 0x8000040080000400;
      auVar41._12_4_ = 0x80000400;
      auVar41._16_4_ = 0x80000400;
      auVar41._20_4_ = 0x80000400;
      auVar41._24_4_ = 0x80000400;
      auVar41._28_4_ = 0x80000400;
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar40 = vpbroadcastd_avx512vl();
      uVar22 = 1;
      auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
      do {
        iVar17 = (int)(this->super_AlignmentEngine).c_;
        ppEVar10 = (ppNVar7[uVar22 - 1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar11 = *(pointer *)
                    ((long)&(ppNVar7[uVar22 - 1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar10 == ppEVar11) {
          iVar18 = (this->super_AlignmentEngine).q_ - iVar17;
        }
        else {
          auVar47 = vpbroadcastq_avx512f();
          auVar47 = vpsrlq_avx512f(auVar47,3);
          uVar27 = 0;
          auVar31 = auVar41;
          do {
            auVar54 = auVar31;
            auVar48 = vpbroadcastq_avx512f();
            auVar48 = vporq_avx512f(auVar48,auVar46);
            uVar16 = vpcmpuq_avx512f(auVar48,auVar47,2);
            vmovdqu64_avx512f(*(undefined1 (*) [64])(ppEVar10 + uVar27));
            bVar15 = (byte)uVar16;
            uVar27 = uVar27 + 8;
            vpgatherqq_avx512f(*(undefined8 *)
                                &(pIVar21->node_id_to_rank).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            auVar31 = vpgatherqd_avx512f(*(undefined8 *)piVar9);
            auVar33._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar31._4_4_;
            auVar33._0_4_ = (uint)(bVar15 & 1) * auVar31._0_4_;
            auVar33._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar31._8_4_;
            auVar33._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar31._12_4_;
            auVar33._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar31._16_4_;
            auVar33._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar31._20_4_;
            auVar33._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar31._24_4_;
            auVar33._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar31._28_4_;
            vpmovzxdq_avx512f(auVar33);
            auVar31 = vpgatherqd_avx512f(*(undefined8 *)
                                          (*(long *)&(pIVar21->node_id_to_rank).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          + (long)pIVar21 * 4));
            auVar32._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar31._4_4_;
            auVar32._0_4_ = (uint)(bVar15 & 1) * auVar31._0_4_;
            auVar32._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar31._8_4_;
            auVar32._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar31._12_4_;
            auVar32._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar31._16_4_;
            auVar32._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar31._20_4_;
            auVar32._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar31._24_4_;
            auVar32._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar31._28_4_;
            auVar31 = vpsubd_avx2(auVar32,auVar39);
            auVar31 = vpmulld_avx2(auVar31,auVar40);
            vpmovzxdq_avx512f(auVar31);
            auVar33 = vpgatherqd_avx512f(*(undefined8 *)(piVar9 + (long)pIVar21));
            auVar31._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar33._4_4_;
            auVar31._0_4_ = (uint)(bVar15 & 1) * auVar33._0_4_;
            auVar31._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar33._8_4_;
            auVar31._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar33._12_4_;
            auVar31._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar33._16_4_;
            auVar31._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar33._20_4_;
            auVar31._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar33._24_4_;
            auVar31._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar33._28_4_;
            auVar31 = vpmaxsd_avx2(auVar54,auVar31);
          } while ((((ulong)((long)ppEVar11 + (-8 - (long)ppEVar10)) >> 3) + 8 & 0x3ffffffffffffff8)
                   != uVar27);
          auVar31 = vmovdqa32_avx512vl(auVar31);
          auVar28._0_4_ =
               (uint)(bVar15 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar54._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar28._4_4_ = (uint)bVar14 * auVar31._4_4_ | (uint)!bVar14 * auVar54._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar28._8_4_ = (uint)bVar14 * auVar31._8_4_ | (uint)!bVar14 * auVar54._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar28._12_4_ = (uint)bVar14 * auVar31._12_4_ | (uint)!bVar14 * auVar54._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar14 * auVar31._16_4_ | (uint)!bVar14 * auVar54._16_4_;
          auVar34._0_16_ = auVar28;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar14 * auVar31._20_4_ | (uint)!bVar14 * auVar54._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar14 * auVar31._24_4_ | (uint)!bVar14 * auVar54._24_4_;
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar34._28_4_ = (uint)bVar14 * auVar31._28_4_ | (uint)!bVar14 * auVar54._28_4_;
          auVar28 = vpmaxsd_avx(auVar28,auVar34._16_16_);
          auVar29 = vpshufd_avx(auVar28,0xee);
          auVar28 = vpmaxsd_avx(auVar28,auVar29);
          auVar29 = vpshufd_avx(auVar28,0x55);
          auVar28 = vpmaxsd_avx(auVar28,auVar29);
          iVar18 = auVar28._0_4_;
        }
        uVar26 = uVar20 * (int)uVar22;
        uVar22 = uVar22 + 1;
        piVar9[uVar26] = iVar18 + iVar17;
        piVar12[uVar26] = -0x7ffffc00;
      } while (uVar22 != uVar25);
    }
LAB_0012183c:
    piVar9 = pIVar21->F;
    *piVar9 = 0;
    piVar12 = pIVar21->E;
    *piVar12 = 0;
    if (1 < uVar20) {
      iVar17 = (int)(this->super_AlignmentEngine).g_;
      cVar1 = (this->super_AlignmentEngine).e_;
      uVar22 = 1;
      do {
        piVar9[uVar22] = -0x7ffffc00;
        piVar12[uVar22] = iVar17;
        uVar22 = uVar22 + 1;
        iVar17 = iVar17 + cVar1;
      } while (uVar20 != uVar22);
    }
    if (1 < uVar25) {
      auVar54._8_4_ = 0x80000400;
      auVar54._0_8_ = 0x8000040080000400;
      auVar54._12_4_ = 0x80000400;
      auVar54._16_4_ = 0x80000400;
      auVar54._20_4_ = 0x80000400;
      auVar54._24_4_ = 0x80000400;
      auVar54._28_4_ = 0x80000400;
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar40 = vpbroadcastd_avx512vl();
      uVar22 = 1;
      auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
      do {
        iVar17 = (int)(this->super_AlignmentEngine).e_;
        ppEVar10 = (ppNVar7[uVar22 - 1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar11 = *(pointer *)
                    ((long)&(ppNVar7[uVar22 - 1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar10 == ppEVar11) {
          iVar18 = (this->super_AlignmentEngine).g_ - iVar17;
        }
        else {
          uVar27 = 0;
          auVar47 = vpbroadcastq_avx512f();
          auVar47 = vpsrlq_avx512f(auVar47,3);
          auVar41 = auVar54;
          do {
            auVar31 = auVar41;
            auVar48 = vpbroadcastq_avx512f();
            auVar48 = vporq_avx512f(auVar48,auVar46);
            uVar16 = vpcmpuq_avx512f(auVar48,auVar47,2);
            vmovdqu64_avx512f(*(undefined1 (*) [64])(ppEVar10 + uVar27));
            bVar15 = (byte)uVar16;
            uVar27 = uVar27 + 8;
            vpgatherqq_avx512f((pIVar21->node_id_to_rank).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            auVar41 = vpgatherqd_avx512f(*(undefined8 *)piVar9);
            auVar35._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
            auVar35._0_4_ = (uint)(bVar15 & 1) * auVar41._0_4_;
            auVar35._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
            auVar35._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
            auVar35._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
            auVar35._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
            auVar35._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
            auVar35._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
            vpmovzxdq_avx512f(auVar35);
            auVar41 = vpgatherqd_avx512f(*(undefined8 *)
                                          (*(long *)&(pIVar21->node_id_to_rank).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data +
                                          (long)pIVar21 * 4));
            auVar36._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
            auVar36._0_4_ = (uint)(bVar15 & 1) * auVar41._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
            auVar36._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
            auVar41 = vpsubd_avx2(auVar36,auVar39);
            auVar41 = vpmulld_avx2(auVar41,auVar40);
            vpmovzxdq_avx512f(auVar41);
            auVar41 = vpgatherqd_avx512f(*(undefined8 *)(piVar9 + (long)pIVar21));
            auVar37._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
            auVar37._0_4_ = (uint)(bVar15 & 1) * auVar41._0_4_;
            auVar37._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
            auVar37._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
            auVar37._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
            auVar37._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
            auVar37._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
            auVar37._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
            auVar41 = vpmaxsd_avx2(auVar31,auVar37);
          } while ((((ulong)((long)ppEVar11 + (-8 - (long)ppEVar10)) >> 3) + 8 & 0x3ffffffffffffff8)
                   != uVar27);
          auVar41 = vmovdqa32_avx512vl(auVar41);
          auVar29._0_4_ =
               (uint)(bVar15 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar31._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar14 * auVar41._4_4_ | (uint)!bVar14 * auVar31._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar14 * auVar41._8_4_ | (uint)!bVar14 * auVar31._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar14 * auVar41._12_4_ | (uint)!bVar14 * auVar31._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar38._16_4_ = (uint)bVar14 * auVar41._16_4_ | (uint)!bVar14 * auVar31._16_4_;
          auVar38._0_16_ = auVar29;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar38._20_4_ = (uint)bVar14 * auVar41._20_4_ | (uint)!bVar14 * auVar31._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar38._24_4_ = (uint)bVar14 * auVar41._24_4_ | (uint)!bVar14 * auVar31._24_4_;
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar38._28_4_ = (uint)bVar14 * auVar41._28_4_ | (uint)!bVar14 * auVar31._28_4_;
          auVar28 = vpmaxsd_avx(auVar29,auVar38._16_16_);
          auVar29 = vpshufd_avx(auVar28,0xee);
          auVar28 = vpmaxsd_avx(auVar28,auVar29);
          auVar29 = vpshufd_avx(auVar28,0x55);
          auVar28 = vpmaxsd_avx(auVar28,auVar29);
          iVar18 = auVar28._0_4_;
        }
        uVar26 = uVar20 * (int)uVar22;
        uVar22 = uVar22 + 1;
        piVar9[uVar26] = iVar18 + iVar17;
        piVar12[uVar26] = -0x7ffffc00;
      } while (uVar22 != uVar25);
    }
  }
  else {
    if (AVar2 == kAffine) {
      pIVar21 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                _M_head_impl;
      goto LAB_0012183c;
    }
    if (AVar2 != kLinear) goto LAB_001219f6;
    pIVar21 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
              _M_head_impl;
  }
  *pIVar21->H = 0;
LAB_001219f6:
  AVar3 = (this->super_AlignmentEngine).type_;
  if (AVar3 == kOV) {
    if (AVar2 == kConvex) {
      if (1 < uVar20) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        uVar22 = 1;
        piVar9 = pIVar21->Q;
        piVar12 = pIVar21->H;
        piVar13 = pIVar21->E;
        do {
          iVar17 = piVar13[uVar22];
          if (piVar13[uVar22] < piVar9[uVar22]) {
            iVar17 = piVar9[uVar22];
          }
          piVar12[uVar22] = iVar17;
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
    }
    else if (AVar2 == kAffine) {
      if (1 < uVar20) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        uVar22 = 1;
        piVar9 = pIVar21->H;
        piVar12 = pIVar21->E;
        do {
          piVar9[uVar22] = piVar12[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
    }
    else if ((AVar2 == kLinear) && (1 < uVar20)) {
      auVar46 = vpmovsxbd_avx512f(_DAT_0014bf1d);
      auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar49 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar50 = vpbroadcastq_avx512f();
      uVar22 = 0;
      piVar9 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl)->H;
      auVar51 = vpbroadcastd_avx512f();
      do {
        auVar52 = vpbroadcastq_avx512f();
        auVar53 = vporq_avx512f(auVar52,auVar47);
        auVar52 = vporq_avx512f(auVar52,auVar48);
        vpcmpuq_avx512f(auVar53,auVar50,2);
        auVar53 = vpmulld_avx512f(auVar46,auVar51);
        vpcmpuq_avx512f(auVar52,auVar50,2);
        auVar46 = vpaddd_avx512f(auVar46,auVar49);
        auVar52 = vmovdqu32_avx512f(auVar53);
        *(undefined1 (*) [64])(piVar9 + uVar22 + 1) = auVar52;
        uVar22 = uVar22 + 0x10;
      } while (((ulong)uVar20 + 0xe & 0xfffffffffffffff0) != uVar22);
    }
    if (1 < uVar25) {
      lVar19 = uVar24 - 1;
      piVar9 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl)->H;
      uVar25 = uVar20;
      do {
        uVar24 = (ulong)uVar25;
        uVar25 = uVar25 + uVar20;
        lVar19 = lVar19 + -1;
        piVar9[uVar24] = 0;
      } while (lVar19 != 0);
    }
  }
  else if (AVar3 == kNW) {
    if (AVar2 == kConvex) {
      if (1 < uVar20) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        uVar22 = 1;
        piVar9 = pIVar21->Q;
        piVar12 = pIVar21->H;
        piVar13 = pIVar21->E;
        do {
          iVar17 = piVar13[uVar22];
          if (piVar13[uVar22] < piVar9[uVar22]) {
            iVar17 = piVar9[uVar22];
          }
          piVar12[uVar22] = iVar17;
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      if (1 < uVar25) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        lVar19 = uVar24 - 1;
        piVar9 = pIVar21->O;
        piVar12 = pIVar21->H;
        piVar13 = pIVar21->F;
        uVar25 = uVar20;
        do {
          iVar17 = piVar13[uVar25];
          if (piVar13[uVar25] < piVar9[uVar25]) {
            iVar17 = piVar9[uVar25];
          }
          lVar19 = lVar19 + -1;
          piVar12[uVar25] = iVar17;
          uVar25 = uVar25 + uVar20;
        } while (lVar19 != 0);
      }
    }
    else if (AVar2 == kAffine) {
      if (1 < uVar20) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        uVar22 = 1;
        piVar9 = pIVar21->H;
        piVar12 = pIVar21->E;
        do {
          piVar9[uVar22] = piVar12[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      if (1 < uVar25) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        lVar19 = uVar24 - 1;
        piVar9 = pIVar21->H;
        piVar12 = pIVar21->F;
        uVar25 = uVar20;
        do {
          lVar19 = lVar19 + -1;
          piVar9[uVar25] = piVar12[uVar25];
          uVar25 = uVar25 + uVar20;
        } while (lVar19 != 0);
      }
    }
    else if (AVar2 == kLinear) {
      if (1 < uVar20) {
        auVar46 = vpmovsxbd_avx512f(_DAT_0014bf1d);
        auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar39 = auVar47._0_32_;
        auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar49 = vpbroadcastd_avx512f(ZEXT416(0x10));
        auVar50 = vpbroadcastq_avx512f();
        uVar22 = 0;
        piVar9 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                 _M_head_impl)->H;
        auVar51 = vpbroadcastd_avx512f();
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar52,auVar47);
          auVar52 = vporq_avx512f(auVar52,auVar48);
          vpcmpuq_avx512f(auVar53,auVar50,2);
          auVar53 = vpmulld_avx512f(auVar46,auVar51);
          vpcmpuq_avx512f(auVar52,auVar50,2);
          auVar46 = vpaddd_avx512f(auVar46,auVar49);
          auVar52 = vmovdqu32_avx512f(auVar53);
          *(undefined1 (*) [64])(piVar9 + uVar22 + 1) = auVar52;
          uVar22 = uVar22 + 0x10;
        } while (((ulong)uVar20 + 0xe & 0xfffffffffffffff0) != uVar22);
      }
      if (1 < uVar25) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                  _M_head_impl;
        auVar55._8_4_ = 0x80000400;
        auVar55._0_8_ = 0x8000040080000400;
        auVar55._12_4_ = 0x80000400;
        auVar55._16_4_ = 0x80000400;
        auVar55._20_4_ = 0x80000400;
        auVar55._24_4_ = 0x80000400;
        auVar55._28_4_ = 0x80000400;
        auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar25 = (uint)(this->super_AlignmentEngine).g_;
        puVar23 = (undefined8 *)(ulong)uVar25;
        auVar40 = vpbroadcastd_avx512vl();
        uVar22 = 1;
        auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
        piVar9 = pIVar21->H;
        do {
          iVar17 = 0;
          ppEVar10 = (ppNVar7[uVar22 - 1]->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar11 = *(pointer *)
                      ((long)&(ppNVar7[uVar22 - 1]->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar10 != ppEVar11) {
            uVar27 = 0;
            auVar47 = vpbroadcastq_avx512f();
            auVar47 = vpsrlq_avx512f(auVar47,3);
            auVar41 = auVar55;
            do {
              auVar31 = auVar41;
              auVar48 = vpbroadcastq_avx512f();
              auVar48 = vporq_avx512f(auVar48,auVar46);
              uVar16 = vpcmpuq_avx512f(auVar48,auVar47,2);
              vmovdqu64_avx512f(*(undefined1 (*) [64])(ppEVar10 + uVar27));
              bVar15 = (byte)uVar16;
              uVar27 = uVar27 + 8;
              vpgatherqq_avx512f(*puVar23);
              auVar41 = vpgatherqd_avx512f(*(undefined8 *)piVar9);
              auVar42._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
              auVar42._0_4_ = (uint)(bVar15 & 1) * auVar41._0_4_;
              auVar42._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
              auVar42._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
              auVar42._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
              auVar42._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
              auVar42._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
              auVar42._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
              vpmovzxdq_avx512f(auVar42);
              auVar41 = vpgatherqd_avx512f(*(undefined8 *)
                                            (*(long *)&(pIVar21->node_id_to_rank).
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            + (long)puVar23 * 4));
              auVar43._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
              auVar43._0_4_ = (uint)(bVar15 & 1) * auVar41._0_4_;
              auVar43._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
              auVar43._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
              auVar43._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
              auVar43._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
              auVar43._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
              auVar43._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
              auVar41 = vpsubd_avx2(auVar43,auVar39);
              auVar41 = vpmulld_avx2(auVar41,auVar40);
              vpmovzxdq_avx512f(auVar41);
              auVar41 = vpgatherqd_avx512f(*(undefined8 *)(piVar9 + (long)puVar23));
              auVar44._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
              auVar44._0_4_ = (uint)(bVar15 & 1) * auVar41._0_4_;
              auVar44._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
              auVar44._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
              auVar44._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
              auVar44._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
              auVar44._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
              auVar44._28_4_ = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
              auVar41 = vpmaxsd_avx2(auVar31,auVar44);
            } while ((((ulong)((long)ppEVar11 + (-8 - (long)ppEVar10)) >> 3) + 8 &
                     0x3ffffffffffffff8) != uVar27);
            auVar41 = vmovdqa32_avx512vl(auVar41);
            auVar30._0_4_ =
                 (uint)(bVar15 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar31._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar30._4_4_ = (uint)bVar14 * auVar41._4_4_ | (uint)!bVar14 * auVar31._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar30._8_4_ = (uint)bVar14 * auVar41._8_4_ | (uint)!bVar14 * auVar31._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar30._12_4_ = (uint)bVar14 * auVar41._12_4_ | (uint)!bVar14 * auVar31._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar45._16_4_ = (uint)bVar14 * auVar41._16_4_ | (uint)!bVar14 * auVar31._16_4_;
            auVar45._0_16_ = auVar30;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar45._20_4_ = (uint)bVar14 * auVar41._20_4_ | (uint)!bVar14 * auVar31._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar45._24_4_ = (uint)bVar14 * auVar41._24_4_ | (uint)!bVar14 * auVar31._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar45._28_4_ = (uint)bVar14 * auVar41._28_4_ | (uint)!bVar14 * auVar31._28_4_;
            auVar28 = vpmaxsd_avx(auVar30,auVar45._16_16_);
            auVar29 = vpshufd_avx(auVar28,0xee);
            auVar28 = vpmaxsd_avx(auVar28,auVar29);
            auVar29 = vpshufd_avx(auVar28,0x55);
            auVar28 = vpmaxsd_avx(auVar28,auVar29);
            iVar17 = auVar28._0_4_;
          }
          iVar18 = (int)uVar22;
          uVar22 = uVar22 + 1;
          piVar9[uVar20 * iVar18] = iVar17 + uVar25;
        } while (uVar22 != uVar24);
      }
    }
  }
  else if (AVar3 == kSW) {
    if (1 < uVar20) {
      memset(((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
             _M_head_impl)->H + 1,0,(ulong)sequence_len << 2);
    }
    if (1 < uVar25) {
      lVar19 = uVar24 - 1;
      piVar9 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
               _M_head_impl)->H;
      uVar25 = uVar20;
      do {
        uVar24 = (ulong)uVar25;
        uVar25 = uVar25 + uVar20;
        lVar19 = lVar19 + -1;
        piVar9[uVar24] = 0;
      } while (lVar19 != 0);
    }
  }
  return;
}

Assistant:

void SisdAlignmentEngine::Initialize(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph) noexcept {
  std::uint32_t matrix_width = sequence_len + 1;
  std::uint32_t matrix_height = graph.nodes().size() + 1;

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    pimpl_->sequence_profile[i * matrix_width] = 0;
    for (std::uint32_t j = 0; j < sequence_len; ++j) {
      pimpl_->sequence_profile[i * matrix_width + (j + 1)] =
          (c == sequence[j] ? m_ : n_);
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      pimpl_->O[0] = 0;
      pimpl_->Q[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->O[j] = kNegativeInfinity;
        pimpl_->Q[j] = q_ + (j - 1) * c_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->O[pred_i * matrix_width]);
        }
        pimpl_->O[i * matrix_width] = penalty + c_;
        pimpl_->Q[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      pimpl_->F[0] = 0;
      pimpl_->E[0] = 0;
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->F[j] = kNegativeInfinity;
        pimpl_->E[j] = g_ + (j - 1) * e_;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->F[pred_i * matrix_width]);
        }
        pimpl_->F[i * matrix_width] = penalty + e_;
        pimpl_->E[i * matrix_width] = kNegativeInfinity;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      pimpl_->H[0] = 0;
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 1; j < matrix_width; ++j) {
        pimpl_->H[j] = 0;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = std::max(
                pimpl_->O[i * matrix_width],
                pimpl_->F[i * matrix_width]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            pimpl_->H[i * matrix_width] = pimpl_->F[i * matrix_width];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->H[pred_i * matrix_width]);
            }
            pimpl_->H[i * matrix_width] = penalty + g_;
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = std::max(pimpl_->Q[j], pimpl_->E[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 1; j < matrix_width; ++j) {
            pimpl_->H[j] = j * g_;
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        pimpl_->H[i * matrix_width] = 0;
      }
      break;
    default:
      break;
  }
}